

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.cc
# Opt level: O3

void __thiscall EvalString::AddSpecial(EvalString *this,StringPiece text)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>
  local_40;
  
  if (text.len_ == 0) {
    local_58 = 0;
    local_50._M_local_buf[0] = '\0';
  }
  else {
    local_60 = &local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,text.str_,text.str_ + text.len_);
    if (local_60 != &local_50) {
      local_40.first._M_dataplus._M_p = (pointer)local_60;
      local_40.first.field_2._M_allocated_capacity =
           CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0]);
      goto LAB_001128b5;
    }
  }
  local_40.first._M_dataplus._M_p = (pointer)&local_40.first.field_2;
  local_40.first.field_2._M_allocated_capacity =
       CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0]);
  local_40.first.field_2._8_8_ = local_50._8_8_;
LAB_001128b5:
  local_40.first._M_string_length = local_58;
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_40.second = SPECIAL;
  local_60 = &local_50;
  std::
  vector<std::pair<std::__cxx11::string,EvalString::TokenType>,std::allocator<std::pair<std::__cxx11::string,EvalString::TokenType>>>
  ::emplace_back<std::pair<std::__cxx11::string,EvalString::TokenType>>
            ((vector<std::pair<std::__cxx11::string,EvalString::TokenType>,std::allocator<std::pair<std::__cxx11::string,EvalString::TokenType>>>
              *)this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != &local_40.first.field_2) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0])
                             + 1);
  }
  return;
}

Assistant:

void EvalString::AddSpecial(StringPiece text) {
  parsed_.push_back(make_pair(text.AsString(), SPECIAL));
}